

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_dirty_update_flush
               (filemgr *file,filemgr_dirty_update_node *node,err_log_callback *log_callback)

{
  int iVar1;
  avl_node *paVar2;
  avl_node *node_00;
  
  if (node != (filemgr_dirty_update_node *)0x0) {
    paVar2 = avl_first(&node->dirty_blocks);
    while (node_00 = paVar2, node_00 != (avl_node *)0x0) {
      paVar2 = avl_next(node_00);
      iVar1 = filemgr_is_writable(file,(bid_t)node_00[1].left);
      if ((iVar1 != 0) && (*(char *)&node_00[1].right == '\0')) {
        filemgr_write(file,(bid_t)node_00[1].left,node_00[1].parent,log_callback);
      }
    }
    node->expired = true;
  }
  return;
}

Assistant:

INLINE void filemgr_dirty_update_flush(struct filemgr *file,
                                       struct filemgr_dirty_update_node *node,
                                       err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block;

    if (!node) {
        return;
    }

    // Flush all dirty blocks belonging to this dirty update entry
    a = avl_first(&node->dirty_blocks);
    while (a) {
        block = _get_entry(a, struct filemgr_dirty_update_block, avl);
        a = avl_next(a);
        if (filemgr_is_writable(file, block->bid) && !block->immutable) {
            filemgr_write(file, block->bid, block->addr, log_callback);
        }
    }
    node->expired = true;
}